

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPhysicalDeviceImage2DViewOf3DFeaturesEXT * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>
          (Impl *this,VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *src,size_t count,
          ScratchAllocator *alloc)

{
  VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPhysicalDeviceImage2DViewOf3DFeaturesEXT>(alloc,count);
    if (pVVar1 != (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)0x0) {
      pVVar1 = (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)memmove(pVVar1,src,count * 0x18);
      return pVVar1;
    }
  }
  return (VkPhysicalDeviceImage2DViewOf3DFeaturesEXT *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}